

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void addLinkLibrary(cmMakefile *mf,string *target,string *lib,cmTargetLinkLibraryType llt)

{
  bool bVar1;
  TargetType TVar2;
  cmTarget *this;
  ostream *poVar3;
  cmGlobalGenerator *this_00;
  cmTarget *this_01;
  string *psVar4;
  string local_378;
  ostringstream local_358 [8];
  ostringstream e_1;
  cmTarget *tgt;
  ostringstream local_1a8 [8];
  ostringstream e;
  cmTarget *t;
  cmTargetLinkLibraryType llt_local;
  string *lib_local;
  string *target_local;
  cmMakefile *mf_local;
  
  this = cmMakefile::FindLocalNonAliasTarget(mf,target);
  if (this == (cmTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = std::operator<<((ostream *)local_1a8,"Attempt to add link library \"");
    poVar3 = std::operator<<(poVar3,(string *)lib);
    poVar3 = std::operator<<(poVar3,"\" to target \"");
    poVar3 = std::operator<<(poVar3,(string *)target);
    std::operator<<(poVar3,"\" which is not built in this directory.");
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)&tgt);
    std::__cxx11::string::~string((string *)&tgt);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    this_00 = cmMakefile::GetGlobalGenerator(mf);
    this_01 = cmGlobalGenerator::FindTarget(this_00,lib,false);
    if (this_01 != (cmTarget *)0x0) {
      TVar2 = cmTarget::GetType(this_01);
      if (TVar2 != STATIC_LIBRARY) {
        TVar2 = cmTarget::GetType(this_01);
        if (TVar2 != SHARED_LIBRARY) {
          TVar2 = cmTarget::GetType(this_01);
          if (TVar2 != INTERFACE_LIBRARY) {
            bVar1 = cmTarget::IsExecutableWithExports(this_01);
            if (!bVar1) {
              std::__cxx11::ostringstream::ostringstream(local_358);
              poVar3 = std::operator<<((ostream *)local_358,"Target \"");
              poVar3 = std::operator<<(poVar3,(string *)lib);
              poVar3 = std::operator<<(poVar3,"\" of type ");
              TVar2 = cmTarget::GetType(this_01);
              psVar4 = cmState::GetTargetTypeName_abi_cxx11_(TVar2);
              poVar3 = std::operator<<(poVar3,(string *)psVar4);
              poVar3 = std::operator<<(poVar3," may not be linked into another target.  ");
              poVar3 = std::operator<<(poVar3,"One may link only to STATIC or SHARED libraries, or "
                                      );
              std::operator<<(poVar3,"to executables with the ENABLE_EXPORTS property set.");
              std::__cxx11::ostringstream::str();
              cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_378);
              std::__cxx11::string::~string((string *)&local_378);
              std::__cxx11::ostringstream::~ostringstream(local_358);
            }
          }
        }
      }
    }
    cmTarget::AddLinkLibrary(this,mf,lib,llt);
  }
  return;
}

Assistant:

static void addLinkLibrary(cmMakefile* mf, std::string const& target,
                           std::string const& lib, cmTargetLinkLibraryType llt)
{
  cmTarget* t = mf->FindLocalNonAliasTarget(target);
  if (!t) {
    std::ostringstream e;
    e << "Attempt to add link library \"" << lib << "\" to target \"" << target
      << "\" which is not built in this directory.";
    mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  cmTarget* tgt = mf->GetGlobalGenerator()->FindTarget(lib);
  if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
      (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
      (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
      !tgt->IsExecutableWithExports()) {
    std::ostringstream e;
    e << "Target \"" << lib << "\" of type "
      << cmState::GetTargetTypeName(tgt->GetType())
      << " may not be linked into another target.  "
      << "One may link only to STATIC or SHARED libraries, or "
      << "to executables with the ENABLE_EXPORTS property set.";
    mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
  }

  t->AddLinkLibrary(*mf, lib, llt);
}